

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O0

void aom_fft32x32_float_c(float *input,float *temp,float *output)

{
  undefined8 in_RDX;
  float *in_RSI;
  float *in_RDI;
  float *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe4;
  
  aom_fft_2d_gen(unaff_retaddr,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),
                 (aom_fft_1d_func_t)CONCAT44(in_stack_ffffffffffffffe4,1),unpack_2d_output,
                 (aom_fft_unpack_func_t)output,(int)temp);
  return;
}

Assistant:

void aom_fft32x32_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 32, aom_fft1d_32_float, simple_transpose,
                 unpack_2d_output, 1);
}